

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
  *reduced_cost;
  rc_data *prVar1;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  bool bVar3;
  uint r_size;
  int iVar4;
  bool bVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
  _Var7;
  rc_data *prVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  rc_data *ret_1;
  long lVar14;
  rc_data *prVar15;
  rc_data *ret;
  int iVar16;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current == last._M_current) {
    bVar5 = false;
  }
  else {
    reduced_cost = this + 0x60;
    bVar5 = false;
    do {
      k = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar14 = *(long *)(this + 0x50);
        _Var6._M_head_impl = local_38._M_head_impl;
        do {
          iVar4 = *_Var6._M_head_impl;
          _Var6._M_head_impl = _Var6._M_head_impl + 8;
          *(double *)(lVar14 + (long)iVar4 * 8) = theta * *(double *)(lVar14 + (long)iVar4 * 8);
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var6._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      lVar14 = (long)k;
      r_size = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                           *)this,(row_iterator)local_38._M_head_impl,
                          (row_iterator)
                          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      iVar4 = -2;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar14)) {
      case 0:
        if (1 < (int)r_size) {
          lVar9 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar9;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar9 = lVar9 * 0x10 + -0x10;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        iVar10 = *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc);
        goto LAB_005609b8;
      case 2:
        if (1 < (int)r_size) {
          lVar9 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar9;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar9 = lVar9 * 0x10 + -0x10;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        iVar10 = *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc);
        if (-1 < (int)r_size) {
          lVar14 = -1;
          iVar11 = 0;
          iVar16 = -2;
          do {
            iVar4 = (int)lVar14;
            if (iVar12 < iVar11) {
              iVar4 = iVar16;
            }
            if (iVar11 < iVar10) {
              iVar4 = iVar16;
            }
            if (iVar4 == -2) {
              if (lVar14 + 1U == (ulong)r_size) break;
            }
            else if ((*(double *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x10 + lVar14 * 0x10) < 0.0) ||
                    (lVar14 + 1U == (ulong)r_size)) goto switchD_0056056d_default;
            lVar14 = lVar14 + 1;
            iVar11 = iVar11 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar14 * 0x10);
            iVar16 = iVar4;
          } while( true );
        }
LAB_005609b8:
        iVar4 = branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                          ((branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *)
                           (this + 0x80),
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size,iVar10,iVar12);
        break;
      case 3:
        if (1 < (int)r_size) {
          lVar9 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar9;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar9 = lVar9 * 0x10 + -0x10;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          lVar9 = -1;
          iVar12 = 0;
          iVar10 = -2;
          do {
            iVar4 = (int)lVar9;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc) < iVar12) {
              iVar4 = iVar10;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc)) {
              iVar4 = iVar10;
            }
            if (iVar4 == -2) {
              if (lVar9 + 1U == (ulong)r_size) break;
            }
            else if ((*(double *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x10 + lVar9 * 0x10) < 0.0) ||
                    (lVar9 + 1U == (ulong)r_size)) goto switchD_0056056d_default;
            lVar9 = lVar9 + 1;
            iVar12 = iVar12 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar9 * 0x10);
            iVar10 = iVar4;
          } while( true );
        }
      case 1:
        iVar4 = exhaustive_solver<baryonyx::itm::maximize_tag,double>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                          ((exhaustive_solver<baryonyx::itm::maximize_tag,double> *)(this + 0xf0),k,
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size);
        break;
      case 4:
        if (1 < (int)r_size) {
          lVar9 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar9;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar9 = lVar9 * 0x10 + -0x10;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          iVar4 = -2;
          uVar13 = 0xffffffffffffffff;
          iVar10 = 0;
          _Var7._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 *)reduced_cost;
          do {
            iVar12 = (int)uVar13;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc) < iVar10) {
              iVar12 = iVar4;
            }
            if (iVar10 < *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc)) {
              iVar12 = iVar4;
            }
            iVar4 = iVar12;
            if ((iVar4 != -2) &&
               (*(double *)
                 _Var7._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl < 0.0)) break;
            iVar10 = iVar10 + *(int *)((long)_Var7._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                                             ._M_head_impl + 0xc);
            uVar13 = uVar13 + 1;
            _Var7._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  )((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                          ._M_head_impl + 0x10);
          } while (r_size != uVar13);
        }
      }
switchD_0056056d_default:
      bVar3 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_38._M_head_impl,k,iVar4,r_size,kappa,delta);
      first._M_current = first._M_current + 1;
      bVar5 = (bool)(bVar5 | bVar3);
    } while (first._M_current != last._M_current);
  }
  return bVar5;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);
            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            Float pi_change;
            int selected = -2;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }